

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_airshield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffff94;
  short sVar3;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,(int)gsn_airshield);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else if (in_RDX->in_room->sector_type == 8) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6dc63a);
    uVar2 = 0;
    sVar3 = gsn_airshield;
    affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    send_to_char((char *)CONCAT26(in_SI,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
    act((char *)CONCAT26(in_SI,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  }
  return;
}

Assistant:

void spell_airshield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_airshield))
	{
		send_to_char("You are already surrounded by a shield of air.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You can't cast that here.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_airshield;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("The air begins to swirl rapidly around you.\n\r", ch);
	act("$n raises $s arms, and swirling winds surround $m.", ch, 0, 0, TO_ROOM);
}